

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_panner_init(ma_panner_config *pConfig,ma_panner *pPanner)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  ma_result local_14;
  
  if (in_RSI == (undefined4 *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI != (undefined4 *)0x0) {
      memset(in_RSI,0,0x10);
    }
    if (in_RDI == (undefined4 *)0x0) {
      local_14 = MA_INVALID_ARGS;
    }
    else {
      *in_RSI = *in_RDI;
      in_RSI[1] = in_RDI[1];
      in_RSI[2] = in_RDI[2];
      in_RSI[3] = in_RDI[3];
      local_14 = MA_SUCCESS;
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_panner_init(const ma_panner_config* pConfig, ma_panner* pPanner)
{
    if (pPanner == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pPanner);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    pPanner->format   = pConfig->format;
    pPanner->channels = pConfig->channels;
    pPanner->mode     = pConfig->mode;
    pPanner->pan      = pConfig->pan;

    return MA_SUCCESS;
}